

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.c
# Opt level: O2

char * vrna_strdup_vprintf(char *format,__va_list_tag *argp)

{
  uint uVar1;
  int iVar2;
  char *__s;
  va_list copy;
  undefined8 local_38;
  void *pvStack_30;
  void *local_28;
  
  local_28 = argp->reg_save_area;
  local_38._0_4_ = argp->gp_offset;
  local_38._4_4_ = argp->fp_offset;
  pvStack_30 = argp->overflow_arg_area;
  uVar1 = vsnprintf((char *)0x0,0,format,argp);
  if (uVar1 < 0x7fffffff) {
    __s = (char *)vrna_alloc(uVar1 + 1);
    if (__s != (char *)0x0) {
      iVar2 = vsnprintf(__s,(ulong)(uVar1 + 1),format,&local_38);
      if (-1 < iVar2) {
        return __s;
      }
      free(__s);
      if (iVar2 != -1) {
        return (char *)0x0;
      }
    }
  }
  vrna_message_warning("vrna_strdup_printf: memory allocation failure!");
  return (char *)0x0;
}

Assistant:

PUBLIC char *
vrna_strdup_vprintf(const char  *format,
                    va_list     argp)
{
  char    *result;
  int     r;

  result = NULL;

#ifndef HAVE_VASPRINTF
  int     count;
  va_list copy;
  va_copy(copy, argp);

  r = -1;

  /* retrieve the number of characters that the string requires */
#ifdef _WIN32
  /*
   * vsnprintf() in Windows is not ANSI compliant, although it's
   * "...included for compliance to the ANSI standard"
   * Thus, we use _vscprintf() that explicitly counts characters
   */
  count = _vscprintf(format, argp);
#else
  count = vsnprintf(NULL, 0, format, argp);
#endif

  if ((count >= 0) && (count < INT_MAX)) {
    char *buf = (char *)vrna_alloc(sizeof(char) * (count + 1));
    if (buf == NULL)
      r = -1;
    else if ((r = vsnprintf(buf, count + 1, format, copy)) < 0)
      free(buf);
    else
      result = buf;
  }

  va_end(copy);  /* Each va_start() or va_copy() needs a va_end() */
#else
  /* the default is to use vasprintf() if available */
  r = vasprintf(&result, format, argp);
#endif

  /* check for any memory allocation error indicated by r == -1 */
  if (r == -1) {
    vrna_message_warning("vrna_strdup_printf: memory allocation failure!");
    result = NULL;
  }

  return result;
}